

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QDockWidgetGroupWindow::childEvent(QDockWidgetGroupWindow *this,QChildEvent *event)

{
  Type TVar1;
  QObject *pQVar2;
  QEvent *in_RSI;
  QDockWidgetGroupWindow *in_stack_00000008;
  QDockWidget *dockWidget_1;
  QDockWidget *dockWidget;
  
  TVar1 = QEvent::type(in_RSI);
  if (TVar1 == ChildAdded) {
    QChildEvent::child((QChildEvent *)in_RSI);
    pQVar2 = (QObject *)qobject_cast<QDockWidget*>((QObject *)0x5f231a);
    if (pQVar2 != (QObject *)0x0) {
      QObject::installEventFilter(pQVar2);
    }
  }
  else if (TVar1 == ChildRemoved) {
    QChildEvent::child((QChildEvent *)in_RSI);
    pQVar2 = (QObject *)qobject_cast<QDockWidget*>((QObject *)0x5f22e0);
    if (pQVar2 != (QObject *)0x0) {
      QObject::removeEventFilter(pQVar2);
    }
    destroyIfSingleItemLeft(in_stack_00000008);
  }
  return;
}

Assistant:

void QDockWidgetGroupWindow::childEvent(QChildEvent *event)
{
    switch (event->type()) {
    case QEvent::ChildRemoved:
        if (auto *dockWidget = qobject_cast<QDockWidget *>(event->child()))
            dockWidget->removeEventFilter(this);
        destroyIfSingleItemLeft();
        break;
    case QEvent::ChildAdded:
        if (auto *dockWidget = qobject_cast<QDockWidget *>(event->child()))
            dockWidget->installEventFilter(this);
        break;
    default:
        break;
    }
}